

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void communicate(char *shared_memory,Arguments *args)

{
  void *__ptr;
  int *in_RSI;
  atomic_char *in_RDI;
  atomic_char *guard;
  void *buffer;
  
  __ptr = malloc((long)*in_RSI);
  *in_RDI = 's';
  while (0 < in_RSI[1]) {
    shm_wait(in_RDI);
    memcpy(__ptr,in_RDI + 1,(long)*in_RSI);
    memset(in_RDI + 1,0x2a,(long)*in_RSI);
    shm_notify(in_RDI);
    in_RSI[1] = in_RSI[1] + -1;
  }
  free(__ptr);
  return;
}

Assistant:

void communicate(char* shared_memory, struct Arguments* args) {
	// Buffer into which to read data
	void* buffer = malloc(args->size);

	atomic_char* guard = (atomic_char*)shared_memory;
	atomic_init(guard, 's');
	assert(sizeof(atomic_char) == 1);

	for (; args->count > 0; --args->count) {
		shm_wait(guard);
		// Read
		memcpy(buffer, shared_memory + 1, args->size);

		// Write back
		memset(shared_memory + 1, '*', args->size);

		shm_notify(guard);
	}

	free(buffer);
}